

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

void vera::splitFacesFromHorizontalRow<float>
               (float *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<float> **_faces)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  CubemapFace<float> *pCVar4;
  ulong uVar5;
  float *pfVar6;
  int n;
  int offset;
  CubemapFace<float> *face;
  int local_40;
  int iFace;
  int l;
  int i;
  int faceHeight;
  int faceWidth;
  CubemapFace<float> **_faces_local;
  size_t _channels_local;
  size_t _height_local;
  size_t _width_local;
  float *_data_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _width;
  iVar3 = SUB164(auVar1 / ZEXT816(6),0);
  for (iFace = 0; iFace < 6; iFace = iFace + 1) {
    pCVar4 = (CubemapFace<float> *)operator_new(0x18);
    memset(pCVar4,0,0x18);
    _faces[iFace] = pCVar4;
    _faces[iFace]->id = iFace;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(iVar3 * 3 * (int)_height);
    uVar5 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pfVar6 = (float *)operator_new__(uVar5);
    _faces[iFace]->data = pfVar6;
    _faces[iFace]->width = iVar3;
    _faces[iFace]->height = (int)_height;
    _faces[iFace]->currentOffset = 0;
  }
  for (local_40 = 0; (ulong)(long)local_40 < _height; local_40 = local_40 + 1) {
    for (face._4_4_ = 0; face._4_4_ < 6; face._4_4_ = face._4_4_ + 1) {
      pCVar4 = _faces[face._4_4_];
      if (pCVar4 != (CubemapFace<float> *)0x0) {
        memcpy(pCVar4->data + pCVar4->currentOffset,
               _data + (iVar3 * face._4_4_ + local_40 * (int)_width) * 3,(long)(iVar3 * 0xc));
        pCVar4->currentOffset = iVar3 * 3 + pCVar4->currentOffset;
      }
    }
  }
  return;
}

Assistant:

void splitFacesFromHorizontalRow(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 6;
    int faceHeight = _height;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        // int jFace = (l - (l % faceHeight)) / faceHeight;
        for (int iFace = 0; iFace < 6; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = 3 * (faceWidth * iFace + l * _width);

            //   0   1   2   3   4   5 i      
            //  +X  -X  +Y  -Y  +Z  -Z 
            //
            face = _faces[iFace];

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * 3;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (3 * faceWidth);
            }
        }
    }
}